

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetTextureDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,TextureDesc *Desc)

{
  uint uVar1;
  undefined8 uVar2;
  char *Delimiter;
  Uint32 CpuAccessFlags;
  String SStack_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Type: ",(allocator *)&SStack_38);
  GetResourceDimString((RESOURCE_DIMENSION)this[8]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0xc));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  uVar2 = std::__cxx11::string::~string((string *)&SStack_38);
  uVar1 = (uint)CONCAT71((int7)((ulong)uVar2 >> 8),this[8]);
  Delimiter = (char *)(ulong)(uVar1 - 4);
  if ((byte)(uVar1 - 4) < 5) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0x10));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&SStack_38);
    uVar1 = (uint)(byte)this[8];
    if (this[8] == (Diligent)0x6) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0x14));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&SStack_38);
      uVar1 = (uint)(byte)this[8];
    }
  }
  if (((byte)uVar1 < 9) && (Delimiter = (char *)0x1a8, (0x1a8U >> (uVar1 & 0x1f) & 1) != 0)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0x14));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&SStack_38);
  }
  GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(this + 0x18));
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0x1c));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  ToString<unsigned_int>(&SStack_38,*(uint *)(this + 0x20));
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetUsageString((USAGE)this[0x28]);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetBindFlagsString_abi_cxx11_
            (&SStack_38,(Diligent *)(ulong)*(uint *)(this + 0x24),0x2e0af3,Delimiter);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  GetCPUAccessFlagsString_abi_cxx11_(&SStack_38,(Diligent *)(ulong)(byte)this[0x29],CpuAccessFlags);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&SStack_38);
  return __return_storage_ptr__;
}

Assistant:

String GetTextureDescString(const TextureDesc& Desc)
{
    String Str = "Type: ";
    Str += GetResourceDimString(Desc.Type);
    Str += "; size: ";
    Str += ToString(Desc.Width);

    if (Desc.Is2D() || Desc.Is3D())
    {
        Str += "x";
        Str += ToString(Desc.Height);
    }

    if (Desc.Is3D())
    {
        Str += "x";
        Str += ToString(Desc.Depth);
    }

    if (Desc.IsArray())
    {
        Str += "; Num Slices: ";
        Str += ToString(Desc.ArraySize);
    }

    const char* FmtName = GetTextureFormatAttribs(Desc.Format).Name;
    Str += "; Format: ";
    Str += FmtName;

    Str += "; Mip levels: ";
    Str += ToString(Desc.MipLevels);

    Str += "; Sample Count: ";
    Str += ToString(Desc.SampleCount);

    Str += "; Usage: ";
    Str += GetUsageString(Desc.Usage);

    Str += "; Bind Flags: ";
    Str += GetBindFlagsString(Desc.BindFlags);

    Str += "; CPU access: ";
    Str += GetCPUAccessFlagsString(Desc.CPUAccessFlags);

    return Str;
}